

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_ibuf::load(xr_ibuf *this,xr_reader *r,size_t n)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  ulong uVar3;
  
  if ((n != 0) && (n == (n / 3) * 3)) {
    if (((this->super_xr_flexbuf).m_owner == true) && (this->m_indices != (uint16_t *)0x0)) {
      operator_delete__(this->m_indices);
    }
    (this->super_xr_flexbuf).m_owner = true;
    (this->super_xr_flexbuf).m_size = 0;
    this->m_indices = (uint16_t *)0x0;
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)n) {
      uVar3 = n * 2;
    }
    puVar2 = (uint16_t *)operator_new__(uVar3);
    this->m_indices = puVar2;
    uVar3 = 0;
    puVar1 = (r->field_2).m_p_u16;
    do {
      *(uint16_t *)((long)puVar2 + uVar3) = *puVar1;
      (r->field_2).m_p_u16 = puVar1 + 1;
      uVar3 = uVar3 + 2;
      puVar1 = puVar1 + 1;
    } while (n * 2 != uVar3);
    (this->super_xr_flexbuf).m_size = n;
    return;
  }
  __assert_fail("n && (n%3 == 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x1d1,"void xray_re::xr_ibuf::load(xr_reader &, size_t)");
}

Assistant:

void xr_ibuf::load(xr_reader& r, size_t n)
{
	xr_assert(n && (n%3 == 0));
	clear();
	m_indices = new uint16_t[n];
	r.r_cseq(n, m_indices);
	set_size(n);
}